

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

unsigned_long file_size(fstream *file)

{
  streamoff __off;
  unsigned_long uVar1;
  fpos<__mbstate_t> local_50;
  fpos<__mbstate_t> local_40;
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  streampos fsize;
  fstream *file_local;
  
  fsize._M_state = (__mbstate_t)file;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_20,0);
  local_30 = std::istream::tellg();
  fsize._M_off = local_30._8_8_;
  local_20 = local_30._0_8_;
  std::istream::seekg((long)fsize._M_state,_S_beg);
  local_50 = (fpos<__mbstate_t>)std::istream::tellg();
  __off = std::fpos<__mbstate_t>::operator-(&local_50,(fpos<__mbstate_t> *)local_20);
  std::fpos<__mbstate_t>::fpos(&local_40,__off);
  local_20 = (undefined1  [8])local_40._M_off;
  fsize._M_off._0_4_ = local_40._M_state.__count;
  fsize._M_off._4_4_ = local_40._M_state.__value;
  std::ios::clear(fsize._M_state.__count + (int)*(undefined8 *)(*(long *)fsize._M_state + -0x18));
  std::istream::seekg((long)fsize._M_state,_S_beg);
  uVar1 = std::fpos::operator_cast_to_long((fpos *)local_20);
  return uVar1;
}

Assistant:

unsigned long file_size(fstream& file) {
    std::streampos fsize = 0;
    fsize = file.tellg();
    file.seekg( 0, std::ios::end);
    fsize = file.tellg() - fsize;
    file.clear();
    file.seekg( 0, std::ios::beg);
    return static_cast<unsigned long>(fsize);
}